

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

UnicodeString *
icu_63::UnicodeString::fromUTF32
          (UnicodeString *__return_storage_ptr__,UChar32 *utf32,int32_t length)

{
  ulong in_RAX;
  char16_t *dest;
  int minCapacity;
  int32_t iVar1;
  UErrorCode errorCode;
  int32_t length16;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00487e70;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  minCapacity = 0x1b;
  if (0x1b < length) {
    minCapacity = ((uint)length >> 4) + length + 4;
  }
  _errorCode = in_RAX;
  while( true ) {
    dest = getBuffer(__return_storage_ptr__,minCapacity);
    _errorCode = _errorCode & 0xffffffff00000000;
    iVar1 = 0x1b;
    if (((__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      iVar1 = (__return_storage_ptr__->fUnion).fFields.fCapacity;
    }
    u_strFromUTF32WithSub_63(dest,iVar1,&length16,utf32,length,0xfffd,(int32_t *)0x0,&errorCode);
    iVar1 = length16;
    releaseBuffer(__return_storage_ptr__,length16);
    if (errorCode != U_BUFFER_OVERFLOW_ERROR) break;
    minCapacity = iVar1 + 1;
  }
  if (U_ZERO_ERROR < errorCode) {
    setToBogus(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString UnicodeString::fromUTF32(const UChar32 *utf32, int32_t length) {
  UnicodeString result;
  int32_t capacity;
  // Most UTF-32 strings will be BMP-only and result in a same-length
  // UTF-16 string. We overestimate the capacity just slightly,
  // just in case there are a few supplementary characters.
  if(length <= US_STACKBUF_SIZE) {
    capacity = US_STACKBUF_SIZE;
  } else {
    capacity = length + (length >> 4) + 4;
  }
  do {
    UChar *utf16 = result.getBuffer(capacity);
    int32_t length16;
    UErrorCode errorCode = U_ZERO_ERROR;
    u_strFromUTF32WithSub(utf16, result.getCapacity(), &length16,
        utf32, length,
        0xfffd,  // Substitution character.
        NULL,    // Don't care about number of substitutions.
        &errorCode);
    result.releaseBuffer(length16);
    if(errorCode == U_BUFFER_OVERFLOW_ERROR) {
      capacity = length16 + 1;  // +1 for the terminating NUL.
      continue;
    } else if(U_FAILURE(errorCode)) {
      result.setToBogus();
    }
    break;
  } while(TRUE);
  return result;
}